

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_group.hpp
# Opt level: O2

void __thiscall
oqpi::
parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::executeImpl(parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              *this)

{
  atomic<unsigned_long> *paVar1;
  ulong uVar2;
  scheduler<concurrent_queue> *hTask;
  bool bVar3;
  long lVar4;
  int local_54;
  __shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2> local_50;
  
  lVar4 = (long)(this->tasks_).
                super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->tasks_).
                super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((lVar4 == 0) &&
     (bVar3 = assert_and_return_false
                        ("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/parallel_group.hpp"
                         ,0x5a,"taskCount > 0","Trying to execute an empty group"), !bVar3)) {
    return;
  }
  local_54 = 0;
  do {
    do {
      LOCK();
      paVar1 = &this->currentTaskIndex_;
      uVar2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      if ((ulong)(lVar4 >> 4) <= uVar2) goto LAB_0019bfd5;
      bVar3 = task_handle::isGrabbed
                        ((this->tasks_).
                         super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar2);
    } while ((bVar3) ||
            (bVar3 = task_handle::isDone((this->tasks_).
                                         super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar2), bVar3))
    ;
    hTask = (this->
            super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
            ).scheduler_;
    std::__shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               (__shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2> *)
               ((this->tasks_).
                super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
                super__Vector_impl_data._M_start + uVar2));
    scheduler<concurrent_queue>::add
              ((scheduler<concurrent_queue> *)&stack0xffffffffffffffc0,(task_handle *)hTask);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  } while ((this->maxSimultaneousTasks_ < 1) ||
          (local_54 = local_54 + 1, local_54 < this->maxSimultaneousTasks_ + -1));
LAB_0019bfd5:
  bVar3 = task_handle::tryGrab
                    ((this->tasks_).
                     super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (bVar3) {
    task_handle::execute
              ((this->tasks_).
               super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual void executeImpl() override final
        {
            const auto taskCount = tasks_.size();
            if (oqpi_ensuref(taskCount > 0, "Trying to execute an empty group"))
            {
                size_t i = 0;
                int32_t scheduledTasks = 0;

                while ((i = currentTaskIndex_.fetch_add(1)) < taskCount)
                {
                    if (!tasks_[i].isGrabbed() && !tasks_[i].isDone())
                    {
                        this->scheduler_.add(tasks_[i]);
                        if (maxSimultaneousTasks_ > 0 && ++scheduledTasks >= maxSimultaneousTasks_-1)
                        {
                            break;
                        }
                    }
                }

                if (tasks_[0].tryGrab())
                {
                    tasks_[0].execute();
                }
            }
        }